

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

void __thiscall HPresolve::testAnAR(HPresolve *this,int post)

{
  reference pvVar1;
  reference pvVar2;
  ostream *poVar3;
  int in_ESI;
  int *in_RDI;
  int nz;
  bool hasValueAR;
  bool hasValueA;
  double valueAR;
  double valueA;
  int k;
  int j;
  int i;
  int cols;
  int rows;
  ostream *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  int local_38;
  bool local_32;
  bool local_31;
  double local_30;
  double local_28;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  
  local_10 = in_RDI[1];
  local_14 = *in_RDI;
  if (in_ESI != 0) {
    local_10 = in_RDI[2];
    local_14 = in_RDI[3];
  }
  for (local_18 = 0; local_18 < local_10; local_18 = local_18 + 1) {
    for (local_1c = 0; local_1c < local_14; local_1c = local_1c + 1) {
      if ((in_ESI != 0) ||
         ((pvVar1 = std::vector<int,_std::allocator<int>_>::at
                              ((vector<int,_std::allocator<int>_> *)
                               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                               (size_type)in_stack_ffffffffffffff78), *pvVar1 != 0 &&
          (pvVar1 = std::vector<int,_std::allocator<int>_>::at
                              ((vector<int,_std::allocator<int>_> *)
                               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                               (size_type)in_stack_ffffffffffffff78), *pvVar1 != 0)))) {
        local_31 = false;
        pvVar1 = std::vector<int,_std::allocator<int>_>::at
                           ((vector<int,_std::allocator<int>_> *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                            (size_type)in_stack_ffffffffffffff78);
        for (local_20 = *pvVar1;
            pvVar1 = std::vector<int,_std::allocator<int>_>::at
                               ((vector<int,_std::allocator<int>_> *)
                                CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                (size_type)in_stack_ffffffffffffff78), local_20 < *pvVar1;
            local_20 = local_20 + 1) {
          pvVar1 = std::vector<int,_std::allocator<int>_>::at
                             ((vector<int,_std::allocator<int>_> *)
                              CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                              (size_type)in_stack_ffffffffffffff78);
          if (*pvVar1 == local_18) {
            local_31 = true;
            pvVar2 = std::vector<double,_std::allocator<double>_>::at
                               ((vector<double,_std::allocator<double>_> *)
                                CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                (size_type)in_stack_ffffffffffffff78);
            local_28 = *pvVar2;
          }
        }
        local_32 = false;
        pvVar1 = std::vector<int,_std::allocator<int>_>::at
                           ((vector<int,_std::allocator<int>_> *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                            (size_type)in_stack_ffffffffffffff78);
        for (local_20 = *pvVar1;
            pvVar1 = std::vector<int,_std::allocator<int>_>::at
                               ((vector<int,_std::allocator<int>_> *)
                                CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                (size_type)in_stack_ffffffffffffff78), local_20 < *pvVar1;
            local_20 = local_20 + 1) {
          pvVar1 = std::vector<int,_std::allocator<int>_>::at
                             ((vector<int,_std::allocator<int>_> *)
                              CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                              (size_type)in_stack_ffffffffffffff78);
          if (*pvVar1 == local_1c) {
            local_32 = true;
            pvVar2 = std::vector<double,_std::allocator<double>_>::at
                               ((vector<double,_std::allocator<double>_> *)
                                CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                (size_type)in_stack_ffffffffffffff78);
            local_30 = *pvVar2;
          }
        }
        if (local_31 == local_32) {
          if ((local_31 != false) && ((local_28 != local_30 || (NAN(local_28) || NAN(local_30))))) {
            poVar3 = std::operator<<((ostream *)&std::cout,"    MATRIX VAL  DIFF row=");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18);
            poVar3 = std::operator<<(poVar3," col=");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c);
            poVar3 = std::operator<<(poVar3,"           ------------A: ");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_28);
            poVar3 = std::operator<<(poVar3,"  AR: ");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_30);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          }
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cout,"    MATRIX is0   DIFF row=");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18);
          poVar3 = std::operator<<(poVar3," col=");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c);
          poVar3 = std::operator<<(poVar3,"           ------------A: ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_31);
          poVar3 = std::operator<<(poVar3,"  AR: ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_32);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
      }
    }
  }
  if (in_ESI == 0) {
    for (local_18 = 0; local_18 < local_10; local_18 = local_18 + 1) {
      pvVar1 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          (size_type)in_stack_ffffffffffffff78);
      if (*pvVar1 != 0) {
        local_38 = 0;
        pvVar1 = std::vector<int,_std::allocator<int>_>::at
                           ((vector<int,_std::allocator<int>_> *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                            (size_type)in_stack_ffffffffffffff78);
        for (local_20 = *pvVar1;
            pvVar1 = std::vector<int,_std::allocator<int>_>::at
                               ((vector<int,_std::allocator<int>_> *)
                                CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                (size_type)in_stack_ffffffffffffff78), local_20 < *pvVar1;
            local_20 = local_20 + 1) {
          std::vector<int,_std::allocator<int>_>::at
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (size_type)in_stack_ffffffffffffff78);
          pvVar1 = std::vector<int,_std::allocator<int>_>::at
                             ((vector<int,_std::allocator<int>_> *)
                              CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                              (size_type)in_stack_ffffffffffffff78);
          if (*pvVar1 != 0) {
            local_38 = local_38 + 1;
          }
        }
        pvVar1 = std::vector<int,_std::allocator<int>_>::at
                           ((vector<int,_std::allocator<int>_> *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                            (size_type)in_stack_ffffffffffffff78);
        if (local_38 != *pvVar1) {
          poVar3 = std::operator<<((ostream *)&std::cout,"    NZ ROW      DIFF row=");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18);
          poVar3 = std::operator<<(poVar3," nzRow=");
          pvVar1 = std::vector<int,_std::allocator<int>_>::at
                             ((vector<int,_std::allocator<int>_> *)
                              CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                              (size_type)in_stack_ffffffffffffff78);
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar1);
          poVar3 = std::operator<<(poVar3," actually ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_38);
          poVar3 = std::operator<<(poVar3,"------------");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
      }
    }
    for (local_1c = 0; local_1c < local_14; local_1c = local_1c + 1) {
      pvVar1 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          (size_type)in_stack_ffffffffffffff78);
      if (*pvVar1 != 0) {
        local_38 = 0;
        pvVar1 = std::vector<int,_std::allocator<int>_>::at
                           ((vector<int,_std::allocator<int>_> *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                            (size_type)in_stack_ffffffffffffff78);
        for (local_20 = *pvVar1;
            pvVar1 = std::vector<int,_std::allocator<int>_>::at
                               ((vector<int,_std::allocator<int>_> *)
                                CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                (size_type)in_stack_ffffffffffffff78), local_20 < *pvVar1;
            local_20 = local_20 + 1) {
          std::vector<int,_std::allocator<int>_>::at
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (size_type)in_stack_ffffffffffffff78);
          pvVar1 = std::vector<int,_std::allocator<int>_>::at
                             ((vector<int,_std::allocator<int>_> *)
                              CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                              (size_type)in_stack_ffffffffffffff78);
          if (*pvVar1 != 0) {
            local_38 = local_38 + 1;
          }
        }
        in_stack_ffffffffffffff84 = local_38;
        pvVar1 = std::vector<int,_std::allocator<int>_>::at
                           ((vector<int,_std::allocator<int>_> *)
                            CONCAT44(local_38,in_stack_ffffffffffffff80),
                            (size_type)in_stack_ffffffffffffff78);
        if (in_stack_ffffffffffffff84 != *pvVar1) {
          poVar3 = std::operator<<((ostream *)&std::cout,"    NZ COL      DIFF col=");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c);
          in_stack_ffffffffffffff78 = std::operator<<(poVar3," nzCol=");
          pvVar1 = std::vector<int,_std::allocator<int>_>::at
                             ((vector<int,_std::allocator<int>_> *)
                              CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                              (size_type)in_stack_ffffffffffffff78);
          poVar3 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffff78,*pvVar1);
          poVar3 = std::operator<<(poVar3," actually ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_38);
          poVar3 = std::operator<<(poVar3,"------------");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
      }
    }
  }
  return;
}

Assistant:

void HPresolve::testAnAR(int post) {
	int rows = numRow;
	int cols = numCol;
	int i,j,k;

	double valueA, valueAR;
	bool hasValueA, hasValueAR;

	if (post) {
		rows = numRowOriginal;
		cols = numColOriginal;
	}

	// check that A = AR
	for (i=0; i<rows; ++i) {
		for (j=0; j<cols; ++j) {
			if (post==0)
				if (!flagRow.at(i) || !flagCol.at(j))
				continue;
			hasValueA = false;
			for (k = Astart.at(j); k<Aend.at(j);++k )
				if (Aindex.at(k) == i) {
					hasValueA = true;
					valueA = Avalue.at(k);
				}

			hasValueAR = false;
			for (k = ARstart.at(i); k<ARstart.at(i+1);++k )
				if (ARindex.at(k) == j) {
					hasValueAR = true;
					valueAR = ARvalue.at(k);
				}

			if (hasValueA != hasValueAR)
				cout<<"    MATRIX is0   DIFF row="<<i<< " col="<<j<<"           ------------A: "<<hasValueA<<"  AR: "<<hasValueAR <<endl;
			else if (hasValueA && valueA != valueAR)
				cout<<"    MATRIX VAL  DIFF row="<<i<< " col="<<j<<"           ------------A: "<<valueA<<"  AR: "<<valueAR <<endl;
		}
	}

	if (post == 0) {
		//check nz
		int nz=0;
		for (i=0; i<rows; ++i) {
			if (!flagRow.at(i))
				continue;
			nz=0;
			for (k = ARstart.at(i); k<ARstart.at(i+1);++k )
				if (flagCol.at(ARindex.at(k)))
					nz++;
			if (nz != nzRow.at(i))
				cout<<"    NZ ROW      DIFF row="<<i<< " nzRow="<<nzRow.at(i)<<" actually "<<nz <<"------------"<<endl;
		}

		for (j=0; j<cols; ++j) {
			if (!flagCol.at(j))
				continue;
			nz=0;
			for (k = Astart.at(j); k<Aend.at(j);++k )
				if (flagRow.at(Aindex.at(k)))
					nz++;
			if (nz != nzCol.at(j))
				cout<<"    NZ COL      DIFF col="<<j<< " nzCol="<<nzCol.at(j)<<" actually "<<nz <<"------------"<<endl;
		}
	}

}